

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

nullres nullcLoadModuleBySource(char *module,char *code)

{
  char **ppcVar1;
  nullres nVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char **local_890;
  char local_87d;
  char *local_878;
  char *bytecode;
  char *pos;
  char path [1024];
  uint local_454;
  uint e;
  uint i;
  char *pos_1;
  char moduleRoot [1024];
  undefined1 local_40 [4];
  uint moduleRootLength;
  TraceScope traceScope;
  char *code_local;
  char *module_local;
  
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    module_local._7_1_ = '\0';
  }
  else {
    if ((nullcLoadModuleBySource::token == '\0') &&
       (iVar3 = __cxa_guard_acquire(&nullcLoadModuleBySource::token), iVar3 != 0)) {
      nullcLoadModuleBySource::token = NULLC::TraceGetToken("nullc","nullcLoadModuleBySource");
      __cxa_guard_release(&nullcLoadModuleBySource::token);
    }
    NULLC::TraceScope::TraceScope((TraceScope *)local_40,nullcLoadModuleBySource::token);
    NULLC::TraceLabel(module);
    moduleRoot[0x3fc] = '\0';
    moduleRoot[0x3fd] = '\x04';
    moduleRoot[0x3fe] = '\0';
    moduleRoot[0x3ff] = '\0';
    pos_1._0_1_ = '\0';
    pcVar4 = strrchr(module,0x2e);
    if (pcVar4 != (char *)0x0) {
      NULLC::SafeSprintf((char *)&pos_1,0x400,"%.*s");
      local_454 = 0;
      sVar5 = strlen((char *)&pos_1);
      for (; local_454 < (uint)sVar5; local_454 = local_454 + 1) {
        if (moduleRoot[(ulong)local_454 - 8] == '.') {
          local_87d = '/';
        }
        else {
          local_87d = moduleRoot[(ulong)local_454 - 8];
        }
        moduleRoot[(ulong)local_454 - 8] = local_87d;
      }
    }
    if ((char)pos_1 == '\0') {
      local_890 = (char **)0x0;
    }
    else {
      local_890 = &pos_1;
    }
    nVar2 = nullcCompileWithModuleRoot(code,(char *)local_890);
    if (nVar2 == '\0') {
      module_local._7_1_ = '\0';
    }
    else {
      sVar5 = strlen(module);
      if (sVar5 < 0x201) {
        strcpy((char *)&pos,module);
        ppcVar1 = &pos;
        while (bytecode = (char *)ppcVar1, *bytecode != '\0') {
          ppcVar1 = (char **)(bytecode + 1);
          if (*bytecode == '.') {
            *bytecode = '/';
          }
        }
        strcat((char *)&pos,".nc");
        pcVar4 = BinaryCache::GetBytecode((char *)&pos);
        if (pcVar4 == (char *)0x0) {
          local_878 = (char *)0x0;
          nullcGetBytecode(&local_878);
          nullcClean();
          BinaryCache::PutBytecode((char *)&pos,local_878,(Lexeme *)0x0,0);
          module_local._7_1_ = '\x01';
        }
        else {
          NULLC::nullcLastError = "ERROR: module already loaded";
          module_local._7_1_ = '\0';
        }
      }
      else {
        NULLC::nullcLastError = "ERROR: module name is too long";
        module_local._7_1_ = '\0';
      }
    }
    NULLC::TraceScope::~TraceScope((TraceScope *)local_40);
  }
  return module_local._7_1_;
}

Assistant:

nullres nullcLoadModuleBySource(const char* module, const char* code)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	TRACE_SCOPE("nullc", "nullcLoadModuleBySource");
	TRACE_LABEL(module);

	const unsigned moduleRootLength = 1024;
	char moduleRoot[moduleRootLength];
	*moduleRoot = 0;

	if(const char *pos = strrchr(module, '.'))
	{
		NULLC::SafeSprintf(moduleRoot, moduleRootLength, "%.*s", unsigned(pos - module), module);

		for(unsigned i = 0, e = unsigned(strlen(moduleRoot)); i < e; i++)
			moduleRoot[i] = moduleRoot[i] == '.' ? '/' : moduleRoot[i];
	}

	if(!nullcCompileWithModuleRoot(code, *moduleRoot ? moduleRoot : NULL))
		return false;

	if(strlen(module) > 512)
	{
		nullcLastError = "ERROR: module name is too long";
		return false;
	}

	char	path[1024];
	strcpy(path, module);
	char	*pos = path;
	while(*pos)
		if(*pos++ == '.')
			pos[-1] = '/';
	strcat(path, ".nc");

	if(BinaryCache::GetBytecode(path))
	{
		nullcLastError = "ERROR: module already loaded";
		return false;
	}

	char *bytecode = NULL;
	nullcGetBytecode(&bytecode);
	nullcClean();

	BinaryCache::PutBytecode(path, bytecode, NULL, 0);
	return 1;
}